

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O1

void __thiscall CFG::printReadable(CFG *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Production *pPVar2;
  pointer pbVar3;
  pointer pcVar4;
  ostream *poVar5;
  pointer ppPVar6;
  char *pcVar7;
  pointer pbVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> el;
  string local_60;
  CFG *local_40;
  pointer local_38;
  
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  pcVar7 = "Nonterminals: ";
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Nonterminals: ",0xe);
  vecToStr(&local_60,(CFG *)pcVar7,&this->nonTerminalsV);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_60._M_dataplus._M_p,local_60._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  paVar1 = &local_60.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  pcVar7 = "Terminals: ";
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Terminals: ",0xb);
  vecToStr(&local_60,(CFG *)pcVar7,&this->terminalsT);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_60._M_dataplus._M_p,local_60._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Productions: ",0xd);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  ppPVar6 = (this->productionsP).super__Vector_base<Production_*,_std::allocator<Production_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_38 = (this->productionsP).super__Vector_base<Production_*,_std::allocator<Production_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  local_40 = this;
  if (ppPVar6 != local_38) {
    do {
      pPVar2 = *ppPVar6;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(pPVar2->fromP)._M_dataplus._M_p,
                          (pPVar2->fromP)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," -> ",4);
      pbVar3 = (pPVar2->toP).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar8 = (pPVar2->toP).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pbVar8 != pbVar3; pbVar8 = pbVar8 + 1
          ) {
        pcVar4 = (pbVar8->_M_dataplus)._M_p;
        local_60._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_60,pcVar4,pcVar4 + pbVar8->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,local_60._M_dataplus._M_p,local_60._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != paVar1) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
      std::ostream::put('X');
      std::ostream::flush();
      ppPVar6 = ppPVar6 + 1;
    } while (ppPVar6 != local_38);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Startsymbol: ",0xd);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(local_40->startS)._M_dataplus._M_p,
                      (local_40->startS)._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  return;
}

Assistant:

void CFG::printReadable() {
    std::cout << std::endl;

    std::cout << "Nonterminals: " << vecToStr(nonTerminalsV) << std::endl;

    std::cout << "Terminals: " << vecToStr(terminalsT) << std::endl;

    std::cout << "Productions: " << std::endl;
    for (Production *production: productionsP) {
        std::cout << "\t" << production->getFromP() << " -> ";
        for (auto el: production->getToP()) {
            std::cout << el;
        }
        std::cout << std::endl;
    }

    std::cout << "Startsymbol: " << startS << std::endl;
    std::cout << std::endl;
}